

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_expression.hpp
# Opt level: O2

string * __thiscall
duckdb::CastExpression::ToString<duckdb::CastExpression,duckdb::ParsedExpression>
          (string *__return_storage_ptr__,CastExpression *this,CastExpression *entry)

{
  pointer pPVar1;
  char *__lhs;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __lhs = "CAST(";
  if (this->try_cast != false) {
    __lhs = "TRY_CAST(";
  }
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->child);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_40,pPVar1);
  ::std::operator+(&local_a0,__lhs,&local_40);
  ::std::operator+(&local_80,&local_a0," AS ");
  LogicalType::ToString_abi_cxx11_(&local_c0,&this->cast_type);
  ::std::operator+(&local_60,&local_80,&local_c0);
  ::std::operator+(__return_storage_ptr__,&local_60,")");
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		return (entry.try_cast ? "TRY_CAST(" : "CAST(") + entry.child->ToString() + " AS " +
		       entry.cast_type.ToString() + ")";
	}